

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O0

Error * ot::commissioner::ReadPemFile
                  (Error *__return_storage_ptr__,ByteArray *aData,string *aFilename)

{
  bool bVar1;
  Error *aError;
  value_type local_aa;
  allocator<unsigned_char> local_a9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  ErrorCode local_80 [4];
  Error local_70;
  undefined1 local_48 [8];
  string str;
  string *aFilename_local;
  ByteArray *aData_local;
  Error *error;
  
  str.field_2._M_local_buf[0xf] = '\0';
  Error::Error(__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_48);
  ReadFile(&local_70,(string *)local_48,aFilename);
  aError = Error::operator=(__return_storage_ptr__,&local_70);
  local_80[0] = kNone;
  bVar1 = operator!=(aError,local_80);
  Error::~Error(&local_70);
  if (!bVar1) {
    local_a0._M_current = (char *)std::__cxx11::string::begin();
    local_a8._M_current = (char *)std::__cxx11::string::end();
    std::allocator<unsigned_char>::allocator(&local_a9);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,local_a0,local_a8,
               &local_a9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(aData,&local_98);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_98);
    std::allocator<unsigned_char>::~allocator(&local_a9);
    local_aa = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(aData,&local_aa);
  }
  str.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_48);
  if ((str.field_2._M_local_buf[0xf] & 1U) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error ReadPemFile(ByteArray &aData, const std::string &aFilename)
{
    Error error;

    std::string str;

    SuccessOrExit(error = ReadFile(str, aFilename));

    aData = {str.begin(), str.end()};
    aData.push_back('\0');

exit:
    return error;
}